

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taggedptr_test.cpp
# Opt level: O3

void __thiscall TaggedPointer_Dispatch_Test::TestBody(TaggedPointer_Dispatch_Test *this)

{
  bool bVar1;
  int iVar2;
  AssertHelper *this_00;
  char *pcVar3;
  AssertionResult gtest_ar;
  Handle h5;
  Handle h4;
  Handle h3;
  Handle h2;
  Handle h6;
  Handle h14;
  Handle h13;
  Handle h12;
  Handle h11;
  Handle h10;
  Handle h9;
  Handle h8;
  Handle h7;
  Handle h1;
  IntType<14> it14;
  IntType<13> it13;
  IntType<12> it12;
  IntType<11> it11;
  IntType<10> it10;
  IntType<9> it9;
  IntType<8> it8;
  IntType<7> it7;
  IntType<6> it6;
  IntType<5> it5;
  IntType<4> it4;
  IntType<3> it3;
  IntType<2> it2;
  IntType<1> it1;
  IntType<0> it0;
  Handle h0;
  AssertionResult local_b8;
  AssertHelper local_a8;
  AssertHelper local_a0;
  AssertHelper local_98;
  AssertHelper local_90;
  AssertHelper local_88;
  AssertHelper local_80;
  AssertHelper local_78;
  AssertHelper local_70;
  AssertHelper local_68;
  AssertHelper local_60;
  AssertHelper local_58;
  AssertHelper local_50;
  AssertHelper local_48;
  AssertHelper local_40;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  AssertHelper local_30;
  undefined1 local_27;
  undefined1 local_26;
  undefined1 local_25;
  undefined1 local_24;
  undefined1 local_23;
  undefined1 local_22;
  undefined1 local_21;
  undefined1 local_20;
  undefined1 local_1f;
  undefined1 local_1e;
  undefined1 local_1d;
  undefined1 local_1c;
  undefined1 local_1b;
  undefined1 local_1a;
  undefined1 local_19;
  Handle local_18;
  
  local_18.
  super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
  .bits = (TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
           )((ulong)&local_19 | 0x1000000000000);
  local_38.ptr_ = local_38.ptr_ & 0xffffffff00000000;
  local_90.data_ = local_90.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_b8,"0","it0.func()",(int *)&local_38,(int *)&local_90);
  if (local_b8.success_ == false) {
    testing::Message::Message((Message *)&local_38);
    if (local_b8.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_b8.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
               ,0x84,pcVar3);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (((local_38.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       (local_38.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_38.ptr_ + 8))();
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_b8.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    return;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_b8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_38.ptr_ = local_38.ptr_ & 0xffffffff00000000;
  iVar2 = Handle::func(&local_18);
  local_90.data_._0_4_ = iVar2;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_b8,"0","h0.func()",(int *)&local_38,(int *)&local_90);
  if (local_b8.success_ == false) {
    testing::Message::Message((Message *)&local_38);
    if (local_b8.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_b8.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
               ,0x85,pcVar3);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (((local_38.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       (local_38.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_38.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_b8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_38.ptr_ = local_38.ptr_ & 0xffffffff00000000;
  local_90.data_ = local_90.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_b8,"0","it0.cfunc()",(int *)&local_38,(int *)&local_90);
  if (local_b8.success_ == false) {
    testing::Message::Message((Message *)&local_38);
    if (local_b8.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_b8.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
               ,0x86,pcVar3);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (((local_38.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       (local_38.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_38.ptr_ + 8))();
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_b8.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    return;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_b8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_38.ptr_ = local_38.ptr_ & 0xffffffff00000000;
  iVar2 = Handle::cfunc(&local_18);
  local_90.data_._0_4_ = iVar2;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_b8,"0","h0.cfunc()",(int *)&local_38,(int *)&local_90);
  if (local_b8.success_ == false) {
    testing::Message::Message((Message *)&local_38);
    if (local_b8.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_b8.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
               ,0x87,pcVar3);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (((local_38.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       (local_38.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_38.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_b8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_38.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)&local_1a | 0x2000000000000);
  local_90.data_._0_4_ = 1;
  local_98.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_b8,"1","it1.func()",(int *)&local_90,(int *)&local_98);
  if (local_b8.success_ == false) {
    testing::Message::Message((Message *)&local_90);
    if (local_b8.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_b8.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
               ,0x8b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (((local_90.data_ != (AssertHelperData *)0x0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       (local_90.data_ != (AssertHelperData *)0x0)) {
      (**(code **)(*(long *)local_90.data_ + 8))();
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_b8.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    return;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_b8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_90.data_._0_4_ = 1;
  local_98.data_._0_4_ = Handle::func((Handle *)&local_38);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_b8,"1","h1.func()",(int *)&local_90,(int *)&local_98);
  if (local_b8.success_ == false) {
    testing::Message::Message((Message *)&local_90);
    if (local_b8.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_b8.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
               ,0x8c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (((local_90.data_ != (AssertHelperData *)0x0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       (local_90.data_ != (AssertHelperData *)0x0)) {
      (**(code **)(*(long *)local_90.data_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_b8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_90.data_._0_4_ = 1;
  local_98.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_b8,"1","it1.cfunc()",(int *)&local_90,(int *)&local_98);
  if (local_b8.success_ == false) {
    testing::Message::Message((Message *)&local_90);
    if (local_b8.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_b8.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
               ,0x8d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (((local_90.data_ != (AssertHelperData *)0x0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       (local_90.data_ != (AssertHelperData *)0x0)) {
      (**(code **)(*(long *)local_90.data_ + 8))();
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_b8.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    return;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_b8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_90.data_._0_4_ = 1;
  local_98.data_._0_4_ = Handle::cfunc((Handle *)&local_38);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_b8,"1","h1.cfunc()",(int *)&local_90,(int *)&local_98);
  if (local_b8.success_ == false) {
    testing::Message::Message((Message *)&local_90);
    if (local_b8.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_b8.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
               ,0x8e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (((local_90.data_ != (AssertHelperData *)0x0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       (local_90.data_ != (AssertHelperData *)0x0)) {
      (**(code **)(*(long *)local_90.data_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_b8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_90.data_ = (AssertHelperData *)((ulong)&local_1b | 0x3000000000000);
  local_a0.data_._0_4_ = 2;
  local_98.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_b8,"2","it2.func()",(int *)&local_98,(int *)&local_a0);
  if (local_b8.success_ == false) {
    testing::Message::Message((Message *)&local_98);
    if (local_b8.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_b8.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
               ,0x92,pcVar3);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (((local_98.data_ != (AssertHelperData *)0x0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       (local_98.data_ != (AssertHelperData *)0x0)) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_b8.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    return;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_b8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_98.data_._0_4_ = 2;
  local_a0.data_._0_4_ = Handle::func((Handle *)&local_90);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_b8,"2","h2.func()",(int *)&local_98,(int *)&local_a0);
  if (local_b8.success_ == false) {
    testing::Message::Message((Message *)&local_98);
    if (local_b8.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_b8.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
               ,0x93,pcVar3);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (((local_98.data_ != (AssertHelperData *)0x0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       (local_98.data_ != (AssertHelperData *)0x0)) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_b8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_98.data_._0_4_ = 2;
  local_a0.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_b8,"2","it2.cfunc()",(int *)&local_98,(int *)&local_a0);
  if (local_b8.success_ == false) {
    testing::Message::Message((Message *)&local_98);
    if (local_b8.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_b8.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
               ,0x94,pcVar3);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (((local_98.data_ != (AssertHelperData *)0x0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       (local_98.data_ != (AssertHelperData *)0x0)) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_b8.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    return;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_b8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_98.data_._0_4_ = 2;
  local_a0.data_._0_4_ = Handle::cfunc((Handle *)&local_90);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_b8,"2","h2.cfunc()",(int *)&local_98,(int *)&local_a0);
  if (local_b8.success_ == false) {
    testing::Message::Message((Message *)&local_98);
    if (local_b8.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_b8.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
               ,0x95,pcVar3);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (((local_98.data_ != (AssertHelperData *)0x0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       (local_98.data_ != (AssertHelperData *)0x0)) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_b8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_98.data_ = (AssertHelperData *)((ulong)&local_1c | 0x4000000000000);
  local_a0.data_._0_4_ = 3;
  local_a8.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_b8,"3","it3.func()",(int *)&local_a0,(int *)&local_a8);
  if (local_b8.success_ == false) {
    testing::Message::Message((Message *)&local_a0);
    if (local_b8.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_b8.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
               ,0x99,pcVar3);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    if (((local_a0.data_ != (AssertHelperData *)0x0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       (local_a0.data_ != (AssertHelperData *)0x0)) {
      (**(code **)(*(long *)local_a0.data_ + 8))();
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_b8.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    return;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_b8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_a0.data_._0_4_ = 3;
  local_a8.data_._0_4_ = Handle::func((Handle *)&local_98);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_b8,"3","h3.func()",(int *)&local_a0,(int *)&local_a8);
  if (local_b8.success_ == false) {
    testing::Message::Message((Message *)&local_a0);
    if (local_b8.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_b8.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
               ,0x9a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    if (((local_a0.data_ != (AssertHelperData *)0x0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       (local_a0.data_ != (AssertHelperData *)0x0)) {
      (**(code **)(*(long *)local_a0.data_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_b8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_a0.data_._0_4_ = 3;
  local_a8.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_b8,"3","it3.cfunc()",(int *)&local_a0,(int *)&local_a8);
  if (local_b8.success_ == false) {
    testing::Message::Message((Message *)&local_a0);
    if (local_b8.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_b8.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
               ,0x9b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    if (((local_a0.data_ != (AssertHelperData *)0x0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       (local_a0.data_ != (AssertHelperData *)0x0)) {
      (**(code **)(*(long *)local_a0.data_ + 8))();
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_b8.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    return;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_b8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_a0.data_._0_4_ = 3;
  local_a8.data_._0_4_ = Handle::cfunc((Handle *)&local_98);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_b8,"3","h3.cfunc()",(int *)&local_a0,(int *)&local_a8);
  if (local_b8.success_ == false) {
    testing::Message::Message((Message *)&local_a0);
    if (local_b8.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_b8.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
               ,0x9c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    if (((local_a0.data_ != (AssertHelperData *)0x0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       (local_a0.data_ != (AssertHelperData *)0x0)) {
      (**(code **)(*(long *)local_a0.data_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_b8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_a0.data_ = (AssertHelperData *)((ulong)&local_1d | 0x5000000000000);
  local_88.data_._0_4_ = 4;
  local_a8.data_._0_4_ = 4;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_b8,"4","it4.func()",(int *)&local_a8,(int *)&local_88);
  if (local_b8.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if (local_b8.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_b8.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
               ,0xa0,pcVar3);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (((local_a8.data_ != (AssertHelperData *)0x0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       (local_a8.data_ != (AssertHelperData *)0x0)) {
      (**(code **)(*(long *)local_a8.data_ + 8))();
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_b8.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    return;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_b8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_a8.data_._0_4_ = 4;
  local_88.data_._0_4_ = Handle::func((Handle *)&local_a0);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_b8,"4","h4.func()",(int *)&local_a8,(int *)&local_88);
  if (local_b8.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if (local_b8.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_b8.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
               ,0xa1,pcVar3);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (((local_a8.data_ != (AssertHelperData *)0x0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       (local_a8.data_ != (AssertHelperData *)0x0)) {
      (**(code **)(*(long *)local_a8.data_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_b8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_a8.data_._0_4_ = 4;
  local_88.data_._0_4_ = 4;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_b8,"4","it4.cfunc()",(int *)&local_a8,(int *)&local_88);
  if (local_b8.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if (local_b8.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_b8.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
               ,0xa2,pcVar3);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (((local_a8.data_ != (AssertHelperData *)0x0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       (local_a8.data_ != (AssertHelperData *)0x0)) {
      (**(code **)(*(long *)local_a8.data_ + 8))();
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_b8.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    return;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_b8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_a8.data_._0_4_ = 4;
  local_88.data_._0_4_ = Handle::cfunc((Handle *)&local_a0);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_b8,"4","h4.cfunc()",(int *)&local_a8,(int *)&local_88);
  if (local_b8.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if (local_b8.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_b8.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
               ,0xa3,pcVar3);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (((local_a8.data_ != (AssertHelperData *)0x0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       (local_a8.data_ != (AssertHelperData *)0x0)) {
      (**(code **)(*(long *)local_a8.data_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_b8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_a8.data_ = (AssertHelperData *)((ulong)&local_1e | 0x6000000000000);
  local_48.data_._0_4_ = 5;
  local_88.data_._0_4_ = 5;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_b8,"5","it5.func()",(int *)&local_88,(int *)&local_48);
  if (local_b8.success_ == false) {
    testing::Message::Message((Message *)&local_88);
    if (local_b8.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_b8.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
               ,0xa7,pcVar3);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (((local_88.data_ != (AssertHelperData *)0x0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       (local_88.data_ != (AssertHelperData *)0x0)) {
      (**(code **)(*(long *)local_88.data_ + 8))();
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_b8.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    return;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_b8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_88.data_._0_4_ = 5;
  local_48.data_._0_4_ = Handle::func((Handle *)&local_a8);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_b8,"5","h5.func()",(int *)&local_88,(int *)&local_48);
  if (local_b8.success_ == false) {
    testing::Message::Message((Message *)&local_88);
    if (local_b8.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_b8.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
               ,0xa8,pcVar3);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (((local_88.data_ != (AssertHelperData *)0x0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       (local_88.data_ != (AssertHelperData *)0x0)) {
      (**(code **)(*(long *)local_88.data_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_b8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_88.data_._0_4_ = 5;
  local_48.data_._0_4_ = 5;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_b8,"5","it5.cfunc()",(int *)&local_88,(int *)&local_48);
  if (local_b8.success_ == false) {
    testing::Message::Message((Message *)&local_88);
    if (local_b8.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_b8.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
               ,0xa9,pcVar3);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (((local_88.data_ != (AssertHelperData *)0x0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       (local_88.data_ != (AssertHelperData *)0x0)) {
      (**(code **)(*(long *)local_88.data_ + 8))();
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_b8.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    return;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_b8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_88.data_._0_4_ = 5;
  local_48.data_._0_4_ = Handle::cfunc((Handle *)&local_a8);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_b8,"5","h5.cfunc()",(int *)&local_88,(int *)&local_48);
  if (local_b8.success_ == false) {
    testing::Message::Message((Message *)&local_88);
    if (local_b8.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_b8.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
               ,0xaa,pcVar3);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::Message::~Message((Message *)&local_88);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_b8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_88.data_ = (AssertHelperData *)((ulong)&local_1f | 0x7000000000000);
  local_50.data_._0_4_ = 6;
  local_48.data_._0_4_ = 6;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_b8,"6","it6.func()",(int *)&local_48,(int *)&local_50);
  if (local_b8.success_ == false) {
    testing::Message::Message((Message *)&local_48);
    if (local_b8.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_b8.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
               ,0xae,pcVar3);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
LAB_003672de:
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    this_00 = &local_48;
  }
  else {
    testing::AssertionResult::~AssertionResult(&local_b8);
    local_48.data_._0_4_ = 6;
    iVar2 = Handle::func((Handle *)&local_88);
    local_50.data_._0_4_ = iVar2;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&local_b8,"6","h6.func()",(int *)&local_48,(int *)&local_50);
    if (local_b8.success_ == false) {
      testing::Message::Message((Message *)&local_48);
      if (local_b8.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((local_b8.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                 ,0xaf,pcVar3);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      testing::Message::~Message((Message *)&local_48);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_b8.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_48.data_._0_4_ = 6;
    local_50.data_._0_4_ = 6;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&local_b8,"6","it6.cfunc()",(int *)&local_48,(int *)&local_50);
    if (local_b8.success_ == false) {
      testing::Message::Message((Message *)&local_48);
      if (local_b8.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((local_b8.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                 ,0xb0,pcVar3);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
      goto LAB_003672de;
    }
    testing::AssertionResult::~AssertionResult(&local_b8);
    local_48.data_._0_4_ = 6;
    iVar2 = Handle::cfunc((Handle *)&local_88);
    local_50.data_._0_4_ = iVar2;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&local_b8,"6","h6.cfunc()",(int *)&local_48,(int *)&local_50);
    if (local_b8.success_ == false) {
      testing::Message::Message((Message *)&local_48);
      if (local_b8.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((local_b8.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                 ,0xb1,pcVar3);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      testing::Message::~Message((Message *)&local_48);
    }
    testing::AssertionResult::~AssertionResult(&local_b8);
    local_48.data_ = (AssertHelperData *)((ulong)&local_20 | 0x8000000000000);
    local_50.data_._0_4_ = 7;
    local_58.data_._0_4_ = 7;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&local_b8,"7","it7.func()",(int *)&local_50,(int *)&local_58);
    if (local_b8.success_ == false) {
      testing::Message::Message((Message *)&local_50);
      if (local_b8.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((local_b8.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                 ,0xb5,pcVar3);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_50);
LAB_00367576:
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      this_00 = &local_50;
    }
    else {
      testing::AssertionResult::~AssertionResult(&local_b8);
      local_50.data_._0_4_ = 7;
      iVar2 = Handle::func((Handle *)&local_48);
      local_58.data_._0_4_ = iVar2;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&local_b8,"7","h7.func()",(int *)&local_50,(int *)&local_58);
      if (local_b8.success_ == false) {
        testing::Message::Message((Message *)&local_50);
        if (local_b8.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((local_b8.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                   ,0xb6,pcVar3);
        testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_50);
        testing::internal::AssertHelper::~AssertHelper(&local_58);
        testing::Message::~Message((Message *)&local_50);
      }
      testing::AssertionResult::~AssertionResult(&local_b8);
      local_50.data_._0_4_ = 7;
      local_58.data_._0_4_ = 7;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&local_b8,"7","it7.cfunc()",(int *)&local_50,(int *)&local_58);
      if (local_b8.success_ == false) {
        testing::Message::Message((Message *)&local_50);
        if (local_b8.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((local_b8.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                   ,0xb7,pcVar3);
        testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_50);
        goto LAB_00367576;
      }
      testing::AssertionResult::~AssertionResult(&local_b8);
      local_50.data_._0_4_ = 7;
      iVar2 = Handle::cfunc((Handle *)&local_48);
      local_58.data_._0_4_ = iVar2;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&local_b8,"7","h7.cfunc()",(int *)&local_50,(int *)&local_58);
      if (local_b8.success_ == false) {
        testing::Message::Message((Message *)&local_50);
        if (local_b8.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((local_b8.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                   ,0xb8,pcVar3);
        testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_50);
        testing::internal::AssertHelper::~AssertHelper(&local_58);
        testing::Message::~Message((Message *)&local_50);
      }
      testing::AssertionResult::~AssertionResult(&local_b8);
      local_50.data_ = (AssertHelperData *)((ulong)&local_21 | 0x9000000000000);
      local_60.data_._0_4_ = 8;
      local_58.data_._0_4_ = 8;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&local_b8,"8","it8.func()",(int *)&local_58,(int *)&local_60);
      if (local_b8.success_ == false) {
        testing::Message::Message((Message *)&local_58);
        if (local_b8.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((local_b8.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                   ,0xbc,pcVar3);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
LAB_00367803:
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        this_00 = &local_58;
      }
      else {
        testing::AssertionResult::~AssertionResult(&local_b8);
        local_58.data_._0_4_ = 8;
        iVar2 = Handle::func((Handle *)&local_50);
        local_60.data_._0_4_ = iVar2;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&local_b8,"8","h8.func()",(int *)&local_58,(int *)&local_60);
        if (local_b8.success_ == false) {
          testing::Message::Message((Message *)&local_58);
          if (local_b8.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar3 = "";
          }
          else {
            pcVar3 = ((local_b8.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_60,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                     ,0xbd,pcVar3);
          testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
          testing::internal::AssertHelper::~AssertHelper(&local_60);
          testing::Message::~Message((Message *)&local_58);
        }
        testing::AssertionResult::~AssertionResult(&local_b8);
        local_58.data_._0_4_ = 8;
        local_60.data_._0_4_ = 8;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&local_b8,"8","it8.cfunc()",(int *)&local_58,(int *)&local_60);
        if (local_b8.success_ == false) {
          testing::Message::Message((Message *)&local_58);
          if (local_b8.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar3 = "";
          }
          else {
            pcVar3 = ((local_b8.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_60,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                     ,0xbe,pcVar3);
          testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
          goto LAB_00367803;
        }
        testing::AssertionResult::~AssertionResult(&local_b8);
        local_58.data_._0_4_ = 8;
        iVar2 = Handle::cfunc((Handle *)&local_50);
        local_60.data_._0_4_ = iVar2;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&local_b8,"8","h8.cfunc()",(int *)&local_58,(int *)&local_60);
        if (local_b8.success_ == false) {
          testing::Message::Message((Message *)&local_58);
          if (local_b8.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar3 = "";
          }
          else {
            pcVar3 = ((local_b8.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_60,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                     ,0xbf,pcVar3);
          testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
          testing::internal::AssertHelper::~AssertHelper(&local_60);
          testing::Message::~Message((Message *)&local_58);
        }
        testing::AssertionResult::~AssertionResult(&local_b8);
        local_58.data_ = (AssertHelperData *)((ulong)&local_22 | 0xa000000000000);
        local_68.data_._0_4_ = 9;
        local_60.data_._0_4_ = 9;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&local_b8,"9","it9.func()",(int *)&local_60,(int *)&local_68);
        if (local_b8.success_ == false) {
          testing::Message::Message((Message *)&local_60);
          if (local_b8.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar3 = "";
          }
          else {
            pcVar3 = ((local_b8.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_68,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                     ,0xc3,pcVar3);
          testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
LAB_00367a90:
          testing::internal::AssertHelper::~AssertHelper(&local_68);
          this_00 = &local_60;
        }
        else {
          testing::AssertionResult::~AssertionResult(&local_b8);
          local_60.data_._0_4_ = 9;
          iVar2 = Handle::func((Handle *)&local_58);
          local_68.data_._0_4_ = iVar2;
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)&local_b8,"9","h9.func()",(int *)&local_60,(int *)&local_68);
          if (local_b8.success_ == false) {
            testing::Message::Message((Message *)&local_60);
            if (local_b8.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar3 = "";
            }
            else {
              pcVar3 = ((local_b8.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_68,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                       ,0xc4,pcVar3);
            testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
            testing::internal::AssertHelper::~AssertHelper(&local_68);
            testing::Message::~Message((Message *)&local_60);
          }
          testing::AssertionResult::~AssertionResult(&local_b8);
          local_60.data_._0_4_ = 9;
          local_68.data_._0_4_ = 9;
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)&local_b8,"9","it9.cfunc()",(int *)&local_60,(int *)&local_68);
          if (local_b8.success_ == false) {
            testing::Message::Message((Message *)&local_60);
            if (local_b8.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar3 = "";
            }
            else {
              pcVar3 = ((local_b8.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_68,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                       ,0xc5,pcVar3);
            testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
            goto LAB_00367a90;
          }
          testing::AssertionResult::~AssertionResult(&local_b8);
          local_60.data_._0_4_ = 9;
          iVar2 = Handle::cfunc((Handle *)&local_58);
          local_68.data_._0_4_ = iVar2;
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)&local_b8,"9","h9.cfunc()",(int *)&local_60,(int *)&local_68);
          if (local_b8.success_ == false) {
            testing::Message::Message((Message *)&local_60);
            if (local_b8.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar3 = "";
            }
            else {
              pcVar3 = ((local_b8.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_68,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                       ,0xc6,pcVar3);
            testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
            testing::internal::AssertHelper::~AssertHelper(&local_68);
            testing::Message::~Message((Message *)&local_60);
          }
          testing::AssertionResult::~AssertionResult(&local_b8);
          local_60.data_ = (AssertHelperData *)((ulong)&local_23 | 0xb000000000000);
          local_70.data_._0_4_ = 10;
          local_68.data_._0_4_ = 10;
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)&local_b8,"10","it10.func()",(int *)&local_68,(int *)&local_70);
          if (local_b8.success_ == false) {
            testing::Message::Message((Message *)&local_68);
            if (local_b8.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar3 = "";
            }
            else {
              pcVar3 = ((local_b8.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_70,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                       ,0xca,pcVar3);
            testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
LAB_00367d1d:
            testing::internal::AssertHelper::~AssertHelper(&local_70);
            this_00 = &local_68;
          }
          else {
            testing::AssertionResult::~AssertionResult(&local_b8);
            local_68.data_._0_4_ = 10;
            iVar2 = Handle::func((Handle *)&local_60);
            local_70.data_._0_4_ = iVar2;
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)&local_b8,"10","h10.func()",(int *)&local_68,(int *)&local_70);
            if (local_b8.success_ == false) {
              testing::Message::Message((Message *)&local_68);
              if (local_b8.message_.ptr_ ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar3 = "";
              }
              else {
                pcVar3 = ((local_b8.message_.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_70,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                         ,0xcb,pcVar3);
              testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
              testing::internal::AssertHelper::~AssertHelper(&local_70);
              testing::Message::~Message((Message *)&local_68);
            }
            testing::AssertionResult::~AssertionResult(&local_b8);
            local_68.data_._0_4_ = 10;
            local_70.data_._0_4_ = 10;
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)&local_b8,"10","it10.cfunc()",(int *)&local_68,(int *)&local_70);
            if (local_b8.success_ == false) {
              testing::Message::Message((Message *)&local_68);
              if (local_b8.message_.ptr_ ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar3 = "";
              }
              else {
                pcVar3 = ((local_b8.message_.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_70,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                         ,0xcc,pcVar3);
              testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
              goto LAB_00367d1d;
            }
            testing::AssertionResult::~AssertionResult(&local_b8);
            local_68.data_._0_4_ = 10;
            iVar2 = Handle::cfunc((Handle *)&local_60);
            local_70.data_._0_4_ = iVar2;
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)&local_b8,"10","h10.cfunc()",(int *)&local_68,(int *)&local_70);
            if (local_b8.success_ == false) {
              testing::Message::Message((Message *)&local_68);
              if (local_b8.message_.ptr_ ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar3 = "";
              }
              else {
                pcVar3 = ((local_b8.message_.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_70,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                         ,0xcd,pcVar3);
              testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
              testing::internal::AssertHelper::~AssertHelper(&local_70);
              testing::Message::~Message((Message *)&local_68);
            }
            testing::AssertionResult::~AssertionResult(&local_b8);
            local_68.data_ = (AssertHelperData *)((ulong)&local_24 | 0xc000000000000);
            local_78.data_._0_4_ = 0xb;
            local_70.data_._0_4_ = 0xb;
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)&local_b8,"11","it11.func()",(int *)&local_70,(int *)&local_78);
            if (local_b8.success_ == false) {
              testing::Message::Message((Message *)&local_70);
              if (local_b8.message_.ptr_ ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar3 = "";
              }
              else {
                pcVar3 = ((local_b8.message_.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_78,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                         ,0xd1,pcVar3);
              testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_70);
LAB_00367faa:
              testing::internal::AssertHelper::~AssertHelper(&local_78);
              this_00 = &local_70;
            }
            else {
              testing::AssertionResult::~AssertionResult(&local_b8);
              local_70.data_._0_4_ = 0xb;
              iVar2 = Handle::func((Handle *)&local_68);
              local_78.data_._0_4_ = iVar2;
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)&local_b8,"11","h11.func()",(int *)&local_70,(int *)&local_78);
              if (local_b8.success_ == false) {
                testing::Message::Message((Message *)&local_70);
                if (local_b8.message_.ptr_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar3 = "";
                }
                else {
                  pcVar3 = ((local_b8.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_78,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                           ,0xd2,pcVar3);
                testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_70);
                testing::internal::AssertHelper::~AssertHelper(&local_78);
                testing::Message::~Message((Message *)&local_70);
              }
              testing::AssertionResult::~AssertionResult(&local_b8);
              local_70.data_._0_4_ = 0xb;
              local_78.data_._0_4_ = 0xb;
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)&local_b8,"11","it11.cfunc()",(int *)&local_70,(int *)&local_78
                        );
              if (local_b8.success_ == false) {
                testing::Message::Message((Message *)&local_70);
                if (local_b8.message_.ptr_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar3 = "";
                }
                else {
                  pcVar3 = ((local_b8.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_78,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                           ,0xd3,pcVar3);
                testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_70);
                goto LAB_00367faa;
              }
              testing::AssertionResult::~AssertionResult(&local_b8);
              local_70.data_._0_4_ = 0xb;
              iVar2 = Handle::cfunc((Handle *)&local_68);
              local_78.data_._0_4_ = iVar2;
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)&local_b8,"11","h11.cfunc()",(int *)&local_70,(int *)&local_78)
              ;
              if (local_b8.success_ == false) {
                testing::Message::Message((Message *)&local_70);
                if (local_b8.message_.ptr_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar3 = "";
                }
                else {
                  pcVar3 = ((local_b8.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_78,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                           ,0xd4,pcVar3);
                testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_70);
                testing::internal::AssertHelper::~AssertHelper(&local_78);
                testing::Message::~Message((Message *)&local_70);
              }
              testing::AssertionResult::~AssertionResult(&local_b8);
              local_70.data_ = (AssertHelperData *)((ulong)&local_25 | 0xd000000000000);
              local_80.data_._0_4_ = 0xc;
              local_78.data_._0_4_ = 0xc;
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)&local_b8,"12","it12.func()",(int *)&local_78,(int *)&local_80)
              ;
              if (local_b8.success_ == false) {
                testing::Message::Message((Message *)&local_78);
                if (local_b8.message_.ptr_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar3 = "";
                }
                else {
                  pcVar3 = ((local_b8.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_80,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                           ,0xd8,pcVar3);
                testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
LAB_00368237:
                testing::internal::AssertHelper::~AssertHelper(&local_80);
                this_00 = &local_78;
              }
              else {
                testing::AssertionResult::~AssertionResult(&local_b8);
                local_78.data_._0_4_ = 0xc;
                iVar2 = Handle::func((Handle *)&local_70);
                local_80.data_._0_4_ = iVar2;
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)&local_b8,"12","h12.func()",(int *)&local_78,(int *)&local_80
                          );
                if (local_b8.success_ == false) {
                  testing::Message::Message((Message *)&local_78);
                  if (local_b8.message_.ptr_ ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar3 = "";
                  }
                  else {
                    pcVar3 = ((local_b8.message_.ptr_)->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_80,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                             ,0xd9,pcVar3);
                  testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
                  testing::internal::AssertHelper::~AssertHelper(&local_80);
                  testing::Message::~Message((Message *)&local_78);
                }
                testing::AssertionResult::~AssertionResult(&local_b8);
                local_78.data_._0_4_ = 0xc;
                local_80.data_._0_4_ = 0xc;
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)&local_b8,"12","it12.cfunc()",(int *)&local_78,
                           (int *)&local_80);
                if (local_b8.success_ == false) {
                  testing::Message::Message((Message *)&local_78);
                  if (local_b8.message_.ptr_ ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar3 = "";
                  }
                  else {
                    pcVar3 = ((local_b8.message_.ptr_)->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_80,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                             ,0xda,pcVar3);
                  testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
                  goto LAB_00368237;
                }
                testing::AssertionResult::~AssertionResult(&local_b8);
                local_78.data_._0_4_ = 0xc;
                iVar2 = Handle::cfunc((Handle *)&local_70);
                local_80.data_._0_4_ = iVar2;
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)&local_b8,"12","h12.cfunc()",(int *)&local_78,
                           (int *)&local_80);
                if (local_b8.success_ == false) {
                  testing::Message::Message((Message *)&local_78);
                  if (local_b8.message_.ptr_ ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar3 = "";
                  }
                  else {
                    pcVar3 = ((local_b8.message_.ptr_)->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_80,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                             ,0xdb,pcVar3);
                  testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
                  testing::internal::AssertHelper::~AssertHelper(&local_80);
                  testing::Message::~Message((Message *)&local_78);
                }
                testing::AssertionResult::~AssertionResult(&local_b8);
                local_78.data_ = (AssertHelperData *)((ulong)&local_26 | 0xe000000000000);
                local_40.data_._0_4_ = 0xd;
                local_80.data_._0_4_ = 0xd;
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)&local_b8,"13","it13.func()",(int *)&local_80,
                           (int *)&local_40);
                if (local_b8.success_ == false) {
                  testing::Message::Message((Message *)&local_80);
                  if (local_b8.message_.ptr_ ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar3 = "";
                  }
                  else {
                    pcVar3 = ((local_b8.message_.ptr_)->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_40,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                             ,0xdf,pcVar3);
                  testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_80);
LAB_003684c4:
                  testing::internal::AssertHelper::~AssertHelper(&local_40);
                  this_00 = &local_80;
                }
                else {
                  testing::AssertionResult::~AssertionResult(&local_b8);
                  local_80.data_._0_4_ = 0xd;
                  local_40.data_._0_4_ = Handle::func((Handle *)&local_78);
                  testing::internal::CmpHelperEQ<int,int>
                            ((internal *)&local_b8,"13","h13.func()",(int *)&local_80,
                             (int *)&local_40);
                  if (local_b8.success_ == false) {
                    testing::Message::Message((Message *)&local_80);
                    if (local_b8.message_.ptr_ ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar3 = "";
                    }
                    else {
                      pcVar3 = ((local_b8.message_.ptr_)->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_40,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                               ,0xe0,pcVar3);
                    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_80);
                    testing::internal::AssertHelper::~AssertHelper(&local_40);
                    testing::Message::~Message((Message *)&local_80);
                  }
                  testing::AssertionResult::~AssertionResult(&local_b8);
                  local_80.data_._0_4_ = 0xd;
                  local_40.data_._0_4_ = 0xd;
                  testing::internal::CmpHelperEQ<int,int>
                            ((internal *)&local_b8,"13","it13.cfunc()",(int *)&local_80,
                             (int *)&local_40);
                  if (local_b8.success_ == false) {
                    testing::Message::Message((Message *)&local_80);
                    if (local_b8.message_.ptr_ ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar3 = "";
                    }
                    else {
                      pcVar3 = ((local_b8.message_.ptr_)->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_40,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                               ,0xe1,pcVar3);
                    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_80);
                    goto LAB_003684c4;
                  }
                  testing::AssertionResult::~AssertionResult(&local_b8);
                  local_80.data_._0_4_ = 0xd;
                  local_40.data_._0_4_ = Handle::cfunc((Handle *)&local_78);
                  testing::internal::CmpHelperEQ<int,int>
                            ((internal *)&local_b8,"13","h13.cfunc()",(int *)&local_80,
                             (int *)&local_40);
                  if (local_b8.success_ == false) {
                    testing::Message::Message((Message *)&local_80);
                    if (local_b8.message_.ptr_ ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar3 = "";
                    }
                    else {
                      pcVar3 = ((local_b8.message_.ptr_)->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_40,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                               ,0xe2,pcVar3);
                    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_80);
                    testing::internal::AssertHelper::~AssertHelper(&local_40);
                    testing::Message::~Message((Message *)&local_80);
                  }
                  testing::AssertionResult::~AssertionResult(&local_b8);
                  local_80.data_ = (AssertHelperData *)((ulong)&local_27 | 0xf000000000000);
                  local_30.data_._0_4_ = 0xe;
                  local_40.data_._0_4_ = 0xe;
                  testing::internal::CmpHelperEQ<int,int>
                            ((internal *)&local_b8,"14","it14.func()",(int *)&local_40,
                             (int *)&local_30);
                  if (local_b8.success_ == false) {
                    testing::Message::Message((Message *)&local_40);
                    if (local_b8.message_.ptr_ ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar3 = "";
                    }
                    else {
                      pcVar3 = ((local_b8.message_.ptr_)->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_30,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                               ,0xe6,pcVar3);
                    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_40);
                  }
                  else {
                    testing::AssertionResult::~AssertionResult(&local_b8);
                    local_40.data_._0_4_ = 0xe;
                    local_30.data_._0_4_ = Handle::func((Handle *)&local_80);
                    testing::internal::CmpHelperEQ<int,int>
                              ((internal *)&local_b8,"14","h14.func()",(int *)&local_40,
                               (int *)&local_30);
                    if (local_b8.success_ == false) {
                      testing::Message::Message((Message *)&local_40);
                      if (local_b8.message_.ptr_ ==
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        pcVar3 = "";
                      }
                      else {
                        pcVar3 = ((local_b8.message_.ptr_)->_M_dataplus)._M_p;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                (&local_30,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                                 ,0xe7,pcVar3);
                      testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_40);
                      testing::internal::AssertHelper::~AssertHelper(&local_30);
                      testing::Message::~Message((Message *)&local_40);
                    }
                    testing::AssertionResult::~AssertionResult(&local_b8);
                    local_40.data_._0_4_ = 0xe;
                    local_30.data_._0_4_ = 0xe;
                    testing::internal::CmpHelperEQ<int,int>
                              ((internal *)&local_b8,"14","it14.cfunc()",(int *)&local_40,
                               (int *)&local_30);
                    if (local_b8.success_ == false) {
                      testing::Message::Message((Message *)&local_40);
                      if (local_b8.message_.ptr_ ==
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        pcVar3 = "";
                      }
                      else {
                        pcVar3 = ((local_b8.message_.ptr_)->_M_dataplus)._M_p;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                (&local_30,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                                 ,0xe8,pcVar3);
                      testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_40);
                    }
                    else {
                      testing::AssertionResult::~AssertionResult(&local_b8);
                      local_40.data_._0_4_ = 0xe;
                      local_30.data_._0_4_ = Handle::cfunc((Handle *)&local_80);
                      testing::internal::CmpHelperEQ<int,int>
                                ((internal *)&local_b8,"14","h14.cfunc()",(int *)&local_40,
                                 (int *)&local_30);
                      if (local_b8.success_ != false) goto LAB_003672f2;
                      testing::Message::Message((Message *)&local_40);
                      if (local_b8.message_.ptr_ ==
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        pcVar3 = "";
                      }
                      else {
                        pcVar3 = ((local_b8.message_.ptr_)->_M_dataplus)._M_p;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                (&local_30,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/taggedptr_test.cpp"
                                 ,0xe9,pcVar3);
                      testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_40);
                    }
                  }
                  testing::internal::AssertHelper::~AssertHelper(&local_30);
                  this_00 = &local_40;
                }
              }
            }
          }
        }
      }
    }
  }
  testing::Message::~Message((Message *)this_00);
LAB_003672f2:
  testing::AssertionResult::~AssertionResult(&local_b8);
  return;
}

Assistant:

TEST(TaggedPointer, Dispatch) {
    IntType<0> it0;
    Handle h0(&it0);
    ASSERT_EQ(0, it0.func());
    EXPECT_EQ(0, h0.func());
    ASSERT_EQ(0, it0.cfunc());
    EXPECT_EQ(0, h0.cfunc());

    IntType<1> it1;
    Handle h1(&it1);
    ASSERT_EQ(1, it1.func());
    EXPECT_EQ(1, h1.func());
    ASSERT_EQ(1, it1.cfunc());
    EXPECT_EQ(1, h1.cfunc());

    IntType<2> it2;
    Handle h2(&it2);
    ASSERT_EQ(2, it2.func());
    EXPECT_EQ(2, h2.func());
    ASSERT_EQ(2, it2.cfunc());
    EXPECT_EQ(2, h2.cfunc());

    IntType<3> it3;
    Handle h3(&it3);
    ASSERT_EQ(3, it3.func());
    EXPECT_EQ(3, h3.func());
    ASSERT_EQ(3, it3.cfunc());
    EXPECT_EQ(3, h3.cfunc());

    IntType<4> it4;
    Handle h4(&it4);
    ASSERT_EQ(4, it4.func());
    EXPECT_EQ(4, h4.func());
    ASSERT_EQ(4, it4.cfunc());
    EXPECT_EQ(4, h4.cfunc());

    IntType<5> it5;
    Handle h5(&it5);
    ASSERT_EQ(5, it5.func());
    EXPECT_EQ(5, h5.func());
    ASSERT_EQ(5, it5.cfunc());
    EXPECT_EQ(5, h5.cfunc());

    IntType<6> it6;
    Handle h6(&it6);
    ASSERT_EQ(6, it6.func());
    EXPECT_EQ(6, h6.func());
    ASSERT_EQ(6, it6.cfunc());
    EXPECT_EQ(6, h6.cfunc());

    IntType<7> it7;
    Handle h7(&it7);
    ASSERT_EQ(7, it7.func());
    EXPECT_EQ(7, h7.func());
    ASSERT_EQ(7, it7.cfunc());
    EXPECT_EQ(7, h7.cfunc());

    IntType<8> it8;
    Handle h8(&it8);
    ASSERT_EQ(8, it8.func());
    EXPECT_EQ(8, h8.func());
    ASSERT_EQ(8, it8.cfunc());
    EXPECT_EQ(8, h8.cfunc());

    IntType<9> it9;
    Handle h9(&it9);
    ASSERT_EQ(9, it9.func());
    EXPECT_EQ(9, h9.func());
    ASSERT_EQ(9, it9.cfunc());
    EXPECT_EQ(9, h9.cfunc());

    IntType<10> it10;
    Handle h10(&it10);
    ASSERT_EQ(10, it10.func());
    EXPECT_EQ(10, h10.func());
    ASSERT_EQ(10, it10.cfunc());
    EXPECT_EQ(10, h10.cfunc());

    IntType<11> it11;
    Handle h11(&it11);
    ASSERT_EQ(11, it11.func());
    EXPECT_EQ(11, h11.func());
    ASSERT_EQ(11, it11.cfunc());
    EXPECT_EQ(11, h11.cfunc());

    IntType<12> it12;
    Handle h12(&it12);
    ASSERT_EQ(12, it12.func());
    EXPECT_EQ(12, h12.func());
    ASSERT_EQ(12, it12.cfunc());
    EXPECT_EQ(12, h12.cfunc());

    IntType<13> it13;
    Handle h13(&it13);
    ASSERT_EQ(13, it13.func());
    EXPECT_EQ(13, h13.func());
    ASSERT_EQ(13, it13.cfunc());
    EXPECT_EQ(13, h13.cfunc());

    IntType<14> it14;
    Handle h14(&it14);
    ASSERT_EQ(14, it14.func());
    EXPECT_EQ(14, h14.func());
    ASSERT_EQ(14, it14.cfunc());
    EXPECT_EQ(14, h14.cfunc());
}